

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSExporter.cpp
# Opt level: O2

string * __thiscall
Assimp::(anonymous_namespace)::GetMeshName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,aiMesh *mesh,uint index,
          aiNode *node)

{
  int iVar1;
  undefined4 in_register_0000000c;
  char postfix [10];
  string result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  char local_50 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::underscore_abi_cxx11_ ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::
                                 underscore_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::
                  underscore_abi_cxx11_,"_",(allocator<char> *)&local_40);
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::
                    underscore_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::
                           underscore_abi_cxx11_);
    }
  }
  local_50[8] = '\0';
  local_50[9] = '\0';
  local_50[0] = '\0';
  local_50[1] = '\0';
  local_50[2] = '\0';
  local_50[3] = '\0';
  local_50[4] = '\0';
  local_50[5] = '\0';
  local_50[6] = '\0';
  local_50[7] = '\0';
  ASSIMP_itoa10<10ul>((char (*) [10])local_50,(int32_t)mesh);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,(char *)(CONCAT44(in_register_0000000c,index) + 4),
             (allocator<char> *)&local_70);
  if (*(int *)(this + 0xec) != 0) {
    std::operator+(&local_70,
                   &GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::
                    underscore_abi_cxx11_,(char *)(this + 0xf0));
    std::__cxx11::string::append((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::operator+(&local_70,&local_40,
                 &GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::
                  underscore_abi_cxx11_);
  std::operator+(__return_storage_ptr__,&local_70,local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string GetMeshName(const aiMesh& mesh, unsigned int index, const aiNode& node) {
        static const std::string underscore = "_";
        char postfix[10] = {0};
        ASSIMP_itoa10(postfix, index);

        std::string result = node.mName.C_Str();
        if (mesh.mName.length > 0) {
            result += underscore + mesh.mName.C_Str();
        }
        return result + underscore + postfix;
    }